

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MapOrSetDataList.h
# Opt level: O2

MapOrSetDataNode<void_*> * __thiscall
Js::MapOrSetDataList<void_*>::Append(MapOrSetDataList<void_*> *this,void **data,Recycler *recycler)

{
  Type *other;
  code *pcVar1;
  bool bVar2;
  Recycler *alloc;
  MapOrSetDataNode<void_*> *this_00;
  undefined4 *puVar3;
  undefined1 local_50 [8];
  TrackAllocData data_1;
  
  local_50 = (undefined1  [8])&MapOrSetDataNode<void*>::typeinfo;
  data_1.typeinfo = (type_info *)0x0;
  data_1.plusSize = 0xffffffffffffffff;
  data_1.count = (size_t)anon_var_dwarf_3c8b036;
  data_1.filename._0_4_ = 0x92;
  alloc = Memory::Recycler::TrackAllocInfo(recycler,(TrackAllocData *)local_50);
  this_00 = (MapOrSetDataNode<void_*> *)new<Memory::Recycler>(0x18,alloc,0x37a1d4);
  MapOrSetDataNode<void_*>::MapOrSetDataNode(this_00,data);
  other = &this->last;
  if ((this->last).ptr == (MapOrSetDataNode<void_*> *)0x0) {
    if ((this->first).ptr != (MapOrSetDataNode<void_*> *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar3 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/MapOrSetDataList.h"
                                  ,0x96,"(first == nullptr)","first == nullptr");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar3 = 0;
    }
  }
  else {
    Memory::WriteBarrierPtr<Js::MapOrSetDataNode<void_*>_>::operator=(&this_00->prev,other);
    this = (MapOrSetDataList<void_*> *)other->ptr;
  }
  Memory::WriteBarrierPtr<Js::MapOrSetDataNode<void_*>_>::WriteBarrierSet(&this->first,this_00);
  Memory::WriteBarrierPtr<Js::MapOrSetDataNode<void_*>_>::WriteBarrierSet(other,this_00);
  return this_00;
}

Assistant:

MapOrSetDataNode<TData>* Append(TData& data, Recycler* recycler)
        {
            // Must allocate with the recycler so that iterators can continue
            // to point to removed nodes.  That is, cannot delete nodes when
            // they are removed.  Reference counting would also work.
            MapOrSetDataNode<TData>* newNode = RecyclerNew(recycler, MapOrSetDataNode<TData>, data);

            if (last == nullptr)
            {
                Assert(first == nullptr);
                first = newNode;
                last = newNode;
            }
            else
            {
                newNode->prev = last;
                last->next = newNode;
                last = newNode;
            }

            return newNode;
        }